

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O1

void __thiscall sptk::reaper::FdFilter::MirrorFilter(FdFilter *this,float *fc,bool invert)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  
  iVar4 = this->n_filter_coeffs_;
  lVar7 = (long)iVar4;
  uVar5 = 0xffffffffffffffff;
  if (-1 < lVar7) {
    uVar5 = lVar7 * 4;
  }
  pfVar1 = (float *)operator_new__(uVar5);
  iVar4 = iVar4 / 2;
  this->filter_coeffs_ = pfVar1;
  pfVar3 = fc + iVar4;
  pfVar2 = pfVar1 + lVar7 + -1;
  fVar8 = 0.0;
  if (1 < lVar7) {
    iVar4 = iVar4 + 1;
    lVar6 = 0;
    lVar7 = 0;
    do {
      fVar9 = *(float *)((long)pfVar3 + lVar6);
      if (invert) {
        fVar8 = fVar8 + fVar9;
        fVar9 = -fVar9;
      }
      *(float *)((long)pfVar1 + lVar7) = fVar9;
      *(float *)((long)pfVar2 + lVar6) = fVar9;
      iVar4 = iVar4 + -1;
      lVar7 = lVar7 + 4;
      lVar6 = lVar6 + -4;
    } while (1 < iVar4);
    fVar8 = fVar8 + fVar8;
    pfVar2 = (float *)((long)pfVar2 - lVar7);
    pfVar3 = (float *)((long)pfVar3 - lVar7);
  }
  fVar9 = *pfVar3;
  if (invert) {
    fVar9 = (fVar8 + fVar9) - fVar9;
  }
  *pfVar2 = fVar9;
  return;
}

Assistant:

void FdFilter::MirrorFilter(float *fc, bool invert) {
  float *dp1, *dp2, *dp3, sum, integral;
  int i, ncoefb2;

  filter_coeffs_ = new float[n_filter_coeffs_];
  ncoefb2 = 1 + n_filter_coeffs_ / 2;
  // Copy the half-filter and its mirror image into the coefficient array.
  for (i = ncoefb2 - 1, dp3 = fc+ncoefb2 - 1, dp2 = filter_coeffs_,
       dp1 = filter_coeffs_ + n_filter_coeffs_ - 1, integral = 0.0; i-- > 0;) {
    if (!invert) {
      *dp1-- = *dp2++ = *dp3--;
    } else {
      integral += (sum = *dp3--);
      *dp1-- = *dp2++ = -sum;
    }
  }
  if (!invert) {
    *dp1 = *dp3; /* point of symmetry */
  } else {
    integral *= 2;
    integral += *dp3;
    *dp1 = integral - *dp3;
  }
}